

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.hpp
# Opt level: O2

deUint8 tcu::getColorMask(PixelFormat *format)

{
  return (format->alphaBits != 0) << 3 |
         (format->blueBits != 0) << 2 | (format->greenBits != 0) * '\x02' | format->redBits != 0;
}

Assistant:

inline deUint8 getColorMask (const tcu::PixelFormat& format)
{
	return (deUint8)((format.redBits	? tcu::RGBA::RED_MASK	: 0) |
					 (format.greenBits	? tcu::RGBA::GREEN_MASK	: 0) |
					 (format.blueBits	? tcu::RGBA::BLUE_MASK	: 0) |
					 (format.alphaBits	? tcu::RGBA::ALPHA_MASK	: 0));
}